

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

char * getVertexName(Abc_Ntk_t *pNtk,int v)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  uint uVar3;
  
  pVVar1 = pNtk->vPos;
  uVar3 = v - pVVar1->nSize;
  if (v < pVVar1->nSize) {
    uVar3 = v;
    if (-1 < v) {
LAB_002a785c:
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[uVar3]);
      return pcVar2;
    }
  }
  else if ((-1 < (int)uVar3) && (pVVar1 = pNtk->vPis, (int)uVar3 < pVVar1->nSize))
  goto LAB_002a785c;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static char * 
getVertexName(Abc_Ntk_t *pNtk, int v)
{   
    Abc_Obj_t * pObj;
    int numouts =  Abc_NtkPoNum(pNtk);

    if (v < numouts)    
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos, v);
    else
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis, v - numouts);       
    
    return Abc_ObjName(pObj);
}